

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O3

void __thiscall ExecutionEngine::i_newarray(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar1;
  ostream *poVar2;
  anon_union_8_10_52016fac_for_data aVar3;
  anon_union_8_10_52016fac_for_data unaff_R14;
  uint uVar4;
  Value VVar5;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar5 = Frame::popTopOfOperandStack(this_01);
  aVar3 = VVar5.data;
  if (VVar5.type != INT) {
    __assert_fail("count.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x10d2,"void ExecutionEngine::i_newarray()");
  }
  uVar4 = VVar5.data._0_4_;
  if (-1 < (int)uVar4) {
    puVar1 = Frame::getCode(this_01,this_01->pc);
    switch(puVar1[1]) {
    case '\x04':
      unaff_R14.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)unaff_R14.object,BOOLEAN);
      while (uVar4 != 0) {
        ArrayObject::pushValue((ArrayObject *)unaff_R14.object,(Value)ZEXT816(0));
        aVar3._0_4_ = aVar3.intValue - 1;
        aVar3.longValue._4_4_ = 0;
        uVar4 = aVar3._0_4_;
      }
      break;
    case '\x05':
      unaff_R14.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)unaff_R14.object,CHAR);
      while (uVar4 != 0) {
        ArrayObject::pushValue((ArrayObject *)unaff_R14.object,(Value)ZEXT816(0x200000002));
        aVar3._0_4_ = aVar3.intValue - 1;
        aVar3.longValue._4_4_ = 0;
        uVar4 = aVar3._0_4_;
      }
      break;
    case '\x06':
      unaff_R14.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)unaff_R14.object,FLOAT);
      while (uVar4 != 0) {
        ArrayObject::pushValue((ArrayObject *)unaff_R14.object,(Value)ZEXT816(0x500000000));
        aVar3._0_4_ = aVar3.intValue - 1;
        aVar3.longValue._4_4_ = 0;
        uVar4 = aVar3._0_4_;
      }
      break;
    case '\a':
      unaff_R14.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)unaff_R14.object,DOUBLE);
      while (uVar4 != 0) {
        ArrayObject::pushValue((ArrayObject *)unaff_R14.object,(Value)ZEXT816(0x700000000));
        aVar3._0_4_ = aVar3.intValue - 1;
        aVar3.longValue._4_4_ = 0;
        uVar4 = aVar3._0_4_;
      }
      break;
    case '\b':
      unaff_R14.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)unaff_R14.object,BYTE);
      while (uVar4 != 0) {
        ArrayObject::pushValue((ArrayObject *)unaff_R14.object,(Value)ZEXT816(0x100000001));
        aVar3._0_4_ = aVar3.intValue - 1;
        aVar3.longValue._4_4_ = 0;
        uVar4 = aVar3._0_4_;
      }
      break;
    case '\t':
      unaff_R14.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)unaff_R14.object,SHORT);
      while (uVar4 != 0) {
        ArrayObject::pushValue((ArrayObject *)unaff_R14.object,(Value)ZEXT816(0x300000003));
        aVar3._0_4_ = aVar3.intValue - 1;
        aVar3.longValue._4_4_ = 0;
        uVar4 = aVar3._0_4_;
      }
      break;
    case '\n':
      unaff_R14.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)unaff_R14.object,INT);
      while (uVar4 != 0) {
        ArrayObject::pushValue((ArrayObject *)unaff_R14.object,(Value)ZEXT816(0x400000004));
        aVar3._0_4_ = aVar3.intValue - 1;
        aVar3.longValue._4_4_ = 0;
        uVar4 = aVar3._0_4_;
      }
      break;
    case '\v':
      unaff_R14.object = (Object *)operator_new(0x28);
      ArrayObject::ArrayObject((ArrayObject *)unaff_R14.object,LONG);
      while (uVar4 != 0) {
        ArrayObject::pushValue((ArrayObject *)unaff_R14.object,(Value)ZEXT816(0x600000000));
        aVar3._0_4_ = aVar3.intValue - 1;
        aVar3.longValue._4_4_ = 0;
        uVar4 = aVar3._0_4_;
      }
    }
    VVar5.data.longValue = unaff_R14.longValue;
    VVar5.printType = BOOLEAN;
    VVar5.type = REFERENCE;
    Frame::pushIntoOperandStack(this_01,VVar5);
    this_01->pc = this_01->pc + 2;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"NegativeArraySizeException");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void ExecutionEngine::i_newarray() {
    VMStack &stackFrame = VMStack::getInstance();       
    Frame *topFrame = stackFrame.getTopFrame();
    
    Value count = topFrame->popTopOfOperandStack(); // Número de elementos no array
    assert(count.type == ValueType::INT);
    
    if (count.data.intValue < 0) {
        cerr << "NegativeArraySizeException" << endl;
        exit(1);
    }
    
    ArrayObject *array; // array que será criado
    Value value; // elemento que irá popular o array
    value.data.longValue = 0; // inicializando Value com 0s
    
    Value padding; // padding poderá ser usado
    padding.type = ValueType::PADDING;
    
    u1 *code = topFrame->getCode(topFrame->pc);
    switch (code[1]) { // argumento representa tipo do array
        case 4:
            array = new ArrayObject(ValueType::BOOLEAN);
            value.type = ValueType::BOOLEAN;
            value.printType = ValueType::BOOLEAN;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 5:
            array = new ArrayObject(ValueType::CHAR);
            value.type = ValueType::CHAR;
            value.printType = ValueType::CHAR;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 6:
            array = new ArrayObject(ValueType::FLOAT);
            value.type = ValueType::FLOAT;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 7:
            array = new ArrayObject(ValueType::DOUBLE);
            value.type = ValueType::DOUBLE;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 8:
            array = new ArrayObject(ValueType::BYTE);
            value.type = ValueType::BYTE;
            value.printType = ValueType::BYTE;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 9:
            array = new ArrayObject(ValueType::SHORT);
            value.type = ValueType::SHORT;
            value.printType = ValueType::SHORT;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 10:
            array = new ArrayObject(ValueType::INT);
            value.type = ValueType::INT;
            value.printType = ValueType::INT;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
        case 11:
            array = new ArrayObject(ValueType::LONG);
            value.type = ValueType::LONG;
            for (int i = 0; i < count.data.intValue; i++) {
                array->pushValue(value);
            }
            break;
    }
    
    Value arrayref; // Referencia pro array na pilha de operandos
    arrayref.type = ValueType::REFERENCE;
    arrayref.data.object = array;
    
    topFrame->pushIntoOperandStack(arrayref);
    topFrame->pc += 2;
}